

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O1

Open_JTalk * Open_JTalk_initialize(void)

{
  Open_JTalk *m;
  
  m = (Open_JTalk *)malloc(0x1f8);
  if (m == (Open_JTalk *)0x0) {
    m = (Open_JTalk *)0x0;
  }
  else {
    Mecab_initialize((Mecab *)m);
    NJD_initialize(&m->njd);
    JPCommon_initialize(&m->jpcommon);
    HTS_Engine_initialize(&m->engine);
  }
  return m;
}

Assistant:

Open_JTalk *Open_JTalk_initialize()
{
	Open_JTalk *open_jtalk = (Open_JTalk *)malloc(sizeof(Open_JTalk));
	if (open_jtalk == NULL)
	{
		return NULL;
	}
	Mecab_initialize(&open_jtalk->mecab);
	NJD_initialize(&open_jtalk->njd);
	JPCommon_initialize(&open_jtalk->jpcommon);
	HTS_Engine_initialize(&open_jtalk->engine);
	return open_jtalk;
}